

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O3

void GEN_CS::gen_cs_example_dm(multi_ex *examples,label *cs_labels)

{
  float fVar1;
  wclass *pwVar2;
  bool bVar3;
  pointer ppeVar4;
  uint32_t uVar5;
  ulong uVar6;
  wclass local_40;
  
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  bVar3 = CB::ec_is_example_header
                    (*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  ppeVar4 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar4) {
    uVar6 = 0;
    do {
      pwVar2 = (ppeVar4[uVar6]->l).cs.costs._begin;
      local_40.x = 0.0;
      uVar5 = (uint32_t)uVar6;
      local_40.partial_prediction = 0.0;
      local_40.wap_value = 0.0;
      local_40.class_index = uVar5;
      if (uVar5 != 0 && bVar3) {
        local_40.class_index = uVar5 - 1;
      }
      if ((long)(ppeVar4[uVar6]->l).cs.costs._end - (long)pwVar2 == 0x10) {
        fVar1 = pwVar2->x;
        if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
          local_40.x = fVar1;
        }
      }
      v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,&local_40);
      uVar6 = (ulong)(uVar5 + 1);
      ppeVar4 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(examples->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar4 >> 3));
  }
  if (bVar3) {
    ((cs_labels->costs)._begin)->class_index = 0;
    ((cs_labels->costs)._begin)->x = -3.4028235e+38;
  }
  return;
}

Assistant:

void gen_cs_example_dm(multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  bool shared = CB::ec_is_example_header(*examples[0]);
  for (uint32_t i = 0; i < examples.size(); i++)
  {
    CB::label ld = examples[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
    if (shared && i > 0)
      wc.class_index = (uint32_t)i - 1;
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
      wc.x = ld.costs[0].cost;
    cs_labels.costs.push_back(wc);
  }

  if (shared)  // take care of shared examples
  {
    cs_labels.costs[0].class_index = 0;
    cs_labels.costs[0].x = -FLT_MAX;
  }
}